

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

void __thiscall despot::Logger::~Logger(Logger *this)

{
  this->_vptr_Logger = (_func_int **)&PTR__Logger_0019b710;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->undiscounted_round_rewards_).
              super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->discounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>)
  ;
  std::__cxx11::string::~string((string *)&this->world_type_);
  return;
}

Assistant:

Logger::~Logger() {
}